

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase125::run(TestCase125 *this)

{
  PointerReader reader;
  Reader reader_00;
  Builder builder_00;
  Reader reader_01;
  Builder reader_02;
  Reader reader_03;
  PointerReader reader_04;
  PointerBuilder builder_01;
  PointerBuilder builder_02;
  Builder builder_03;
  Builder builder_04;
  undefined8 uVar1;
  anon_union_8_2_eba6ea51_for_Type_5 aVar2;
  anon_union_8_2_eba6ea51_for_Type_5 aVar3;
  int iVar4;
  ulong uVar6;
  word wVar7;
  ListSchema LVar8;
  Orphanage OVar9;
  Own<capnp::ClientHook> OVar10;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  initializer_list<unsigned_int> expected;
  initializer_list<unsigned_int> expected_00;
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> list_1;
  BuilderFor<capnp::DynamicList> list;
  Builder root;
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> lorphan;
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan;
  MallocMessageBuilder builder;
  anon_union_8_2_eba6ea51_for_Type_5 local_3e8;
  Type TStack_3e0;
  int in_stack_fffffffffffffc30;
  uint in_stack_fffffffffffffc34;
  uint uVar11;
  undefined4 in_stack_fffffffffffffc38;
  short in_stack_fffffffffffffc3c;
  undefined2 in_stack_fffffffffffffc3e;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  undefined8 in_stack_fffffffffffffc48;
  WirePointer *in_stack_fffffffffffffc50;
  anon_union_8_2_eba6ea51_for_Type_5 local_3a0;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_398;
  anon_union_8_2_eba6ea51_for_Type_5 local_390;
  OrphanBuilder OStack_388;
  anon_union_8_2_eba6ea51_for_Type_5 local_368;
  anon_union_8_2_eba6ea51_for_Type_5 in_stack_fffffffffffffca0;
  anon_union_8_2_eba6ea51_for_Type_5 aVar12;
  undefined8 in_stack_fffffffffffffca8;
  SegmentBuilder *in_stack_fffffffffffffcb0;
  SegmentBuilder *pSVar13;
  anon_union_8_2_eba6ea51_for_Type_5 local_340;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_338;
  undefined4 in_stack_fffffffffffffcdc;
  undefined8 in_stack_fffffffffffffce0;
  undefined8 in_stack_fffffffffffffce8;
  uint in_stack_fffffffffffffcf0;
  uint uVar14;
  undefined4 in_stack_fffffffffffffcf4;
  undefined4 uVar15;
  SegmentBuilder *pSStack_308;
  anon_union_8_2_eba6ea51_for_Type_5 local_2e8;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_2e0;
  SegmentBuilder *local_2d8;
  StructBuilder local_2c8;
  StructBuilder local_2a0;
  StructBuilder local_278;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  StructReader local_1b0;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> local_180 [48];
  Type local_150;
  SegmentReader *local_140;
  CapTableReader *pCStack_138;
  byte *local_130;
  ListElementCount LStack_128;
  BitsPerElementN<23> BStack_124;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffef0 [32];
  size_type sVar5;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&stack0xfffffffffffffef0,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_3a0,(MessageBuilder *)&stack0xfffffffffffffef0);
  local_3e8 = local_3a0;
  PointerBuilder::getStruct
            ((StructBuilder *)&local_368,(PointerBuilder *)&local_3e8,(StructSize)0x10000,
             (word *)0x0);
  local_3e8 = local_368;
  TStack_3e0._0_8_ = in_stack_fffffffffffffca0;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
            (local_180,(EVP_PKEY_CTX *)(schemas::s_a0a8f314b80b63fd + 0x48));
  builder_04.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffee8;
  builder_04.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffee0;
  builder_04.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffef0._0_8_;
  builder_04.builder.data = (void *)in_stack_fffffffffffffef0._8_8_;
  builder_04.builder.pointers = (WirePointer *)in_stack_fffffffffffffef0._16_8_;
  builder_04.builder.dataSize = in_stack_fffffffffffffef0._24_4_;
  builder_04.builder.pointerCount = in_stack_fffffffffffffef0._28_2_;
  builder_04.builder._38_2_ = in_stack_fffffffffffffef0._30_2_;
  initDynamicTestMessage(builder_04);
  StructBuilder::asReader((StructBuilder *)&local_368);
  if (in_stack_fffffffffffffc3c == 0) {
    OStack_388.tag.content._0_4_ = 0x7fffffff;
    aStack_398.schema = (RawBrandedSchema *)0x0;
    local_390.schema = (RawBrandedSchema *)0x0;
    local_3a0.schema = (RawBrandedSchema *)0x0;
  }
  else {
    local_390 = (anon_union_8_2_eba6ea51_for_Type_5)
                CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30);
    aStack_398 = (anon_union_8_2_eba6ea51_for_Type_5)TStack_3e0._0_8_;
    local_3a0 = local_3e8;
    OStack_388.tag.content._0_4_ = in_stack_fffffffffffffc40;
  }
  PointerReader::getStruct(&local_1b0,(PointerReader *)&local_3a0,(word *)0x0);
  reader_00._reader.capTable = local_1b0.capTable;
  reader_00._reader.segment = local_1b0.segment;
  reader_00._reader.data = local_1b0.data;
  reader_00._reader.pointers = local_1b0.pointers;
  reader_00._reader.dataSize = local_1b0.dataSize;
  reader_00._reader.pointerCount = local_1b0.pointerCount;
  reader_00._reader._38_2_ = local_1b0._38_2_;
  reader_00._reader.nestingLimit = local_1b0.nestingLimit;
  reader_00._reader._44_4_ = local_1b0._44_4_;
  checkTestMessage(reader_00);
  StructBuilder::asReader((StructBuilder *)&local_368);
  if (in_stack_fffffffffffffc3c == 0) {
    OStack_388.tag.content._0_4_ = 0x7fffffff;
    TStack_3e0._0_8_ = (RawBrandedSchema *)0x0;
    local_390.schema = (RawBrandedSchema *)0x0;
    local_3a0.schema = (RawBrandedSchema *)0x0;
  }
  else {
    local_390 = (anon_union_8_2_eba6ea51_for_Type_5)
                CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30);
    local_3a0 = local_3e8;
    OStack_388.tag.content._0_4_ = in_stack_fffffffffffffc40;
  }
  reader_04.segment._4_4_ = in_stack_fffffffffffffc34;
  reader_04.segment._0_4_ = in_stack_fffffffffffffc30;
  reader_04.capTable._0_4_ = in_stack_fffffffffffffc38;
  reader_04.capTable._4_2_ = in_stack_fffffffffffffc3c;
  reader_04.capTable._6_2_ = in_stack_fffffffffffffc3e;
  reader_04.pointer._0_4_ = in_stack_fffffffffffffc40;
  reader_04.pointer._4_4_ = in_stack_fffffffffffffc44;
  reader_04._24_8_ = in_stack_fffffffffffffc48;
  aStack_398 = (anon_union_8_2_eba6ea51_for_Type_5)TStack_3e0._0_8_;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
            (reader_04,(StructSchema)TStack_3e0._0_8_);
  reader_01.reader.segment = (SegmentReader *)uStack_210;
  reader_01.schema.super_Schema.raw = (Schema)(Schema)local_218;
  reader_01.reader.capTable = (CapTableReader *)local_208;
  reader_01.reader.data = (void *)uStack_200;
  reader_01.reader.pointers = (WirePointer *)local_1f8;
  reader_01.reader.dataSize = (undefined4)uStack_1f0;
  reader_01.reader.pointerCount = uStack_1f0._4_2_;
  reader_01.reader._38_2_ = uStack_1f0._6_2_;
  reader_01.reader._40_8_ = local_1e8;
  checkDynamicTestMessage(reader_01);
  local_3e8 = local_368;
  builder_01.segment._4_4_ = in_stack_fffffffffffffc44;
  builder_01.segment._0_4_ = in_stack_fffffffffffffc40;
  builder_01.capTable = (CapTableBuilder *)in_stack_fffffffffffffc48;
  builder_01.pointer = in_stack_fffffffffffffc50;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
            (builder_01,(StructSchema)in_stack_fffffffffffffca0);
  builder_00.builder.segment = (SegmentBuilder *)uStack_1d8;
  builder_00.schema.super_Schema.raw = (Schema)(Schema)local_1e0;
  builder_00.builder.capTable = (CapTableBuilder *)local_1d0;
  builder_00.builder.data = (void *)uStack_1c8;
  builder_00.builder.pointers = (WirePointer *)local_1c0;
  builder_00.builder.dataSize = (undefined4)uStack_1b8;
  builder_00.builder.pointerCount = uStack_1b8._4_2_;
  builder_00.builder._38_2_ = uStack_1b8._6_2_;
  checkDynamicTestMessage(builder_00);
  local_3e8 = local_368;
  TStack_3e0.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)in_stack_fffffffffffffcb0;
  ListSchema::of(UINT32);
  PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::init((EVP_PKEY_CTX *)&local_3a0);
  local_3e8.scopeId._0_4_ = 3;
  TStack_3e0.baseType = 0x7b;
  TStack_3e0.listDepth = '\0';
  TStack_3e0.isImplicitParam = false;
  TStack_3e0.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  TStack_3e0._6_2_ = 0;
  DynamicList::Builder::set((Builder *)&local_3a0,0,(Reader *)&local_3e8);
  DynamicValue::Reader::~Reader((Reader *)&local_3e8);
  local_3e8.scopeId._0_4_ = 3;
  TStack_3e0.baseType = 0x1c8;
  TStack_3e0.listDepth = '\0';
  TStack_3e0.isImplicitParam = false;
  TStack_3e0.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  TStack_3e0._6_2_ = 0;
  DynamicList::Builder::set((Builder *)&local_3a0,1,(Reader *)&local_3e8);
  DynamicValue::Reader::~Reader((Reader *)&local_3e8);
  local_3e8.scopeId._0_4_ = 3;
  TStack_3e0.baseType = 0x315;
  TStack_3e0.listDepth = '\0';
  TStack_3e0.isImplicitParam = false;
  TStack_3e0.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  TStack_3e0._6_2_ = 0;
  DynamicList::Builder::set((Builder *)&local_3a0,2,(Reader *)&local_3e8);
  DynamicValue::Reader::~Reader((Reader *)&local_3e8);
  local_3e8.scopeId._0_4_ = 3;
  TStack_3e0.baseType = 0xcd15;
  TStack_3e0.listDepth = '[';
  TStack_3e0.isImplicitParam = true;
  TStack_3e0.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  TStack_3e0._6_2_ = 0;
  DynamicList::Builder::set((Builder *)&local_3a0,3,(Reader *)&local_3e8);
  DynamicValue::Reader::~Reader((Reader *)&local_3e8);
  StructBuilder::asReader((StructBuilder *)&local_368);
  aStack_338 = aStack_398;
  wVar7.content = OStack_388.tag.content;
  local_340 = local_3a0;
  if (OStack_388.segment._4_2_ == 0) {
    OStack_388.capTable._0_4_ = 0x7fffffff;
    aStack_338.schema = (RawBrandedSchema *)0x0;
    wVar7.content = 0;
    local_340.schema = (RawBrandedSchema *)0x0;
  }
  PointerReader::getList
            ((ListReader *)&local_3e8,(PointerReader *)&local_340,FOUR_BYTES,(word *)0x0);
  if (in_stack_fffffffffffffc30 != 4) {
    local_340.scopeId._0_4_ = 4;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&local_3a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x95,FAILED,"(4u) == (list.size())","4u, list.size()",(uint *)&local_340.scopeId,
               (uint *)&stack0xfffffffffffffcf0);
    kj::_::Debug::Fault::fatal((Fault *)&local_3a0);
  }
  uVar15 = OStack_388.capTable._0_4_;
  if ((*(uint *)&((SegmentReader *)TStack_3e0.field_4)->arena != 0x7b) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_3a0.scopeId._0_4_ = 0x7b;
    local_340.scopeId._0_4_ = *(uint *)&((SegmentReader *)TStack_3e0.field_4)->arena;
    kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x96,ERROR,"\"failed: expected \" \"(123u) == (list[0])\", 123u, list[0]",
               (char (*) [37])"failed: expected (123u) == (list[0])",(uint *)&local_3a0.scopeId,
               (uint *)&local_340.scopeId);
    uVar15 = OStack_388.capTable._0_4_;
  }
  if ((*(int *)((long)&((SegmentReader *)TStack_3e0.field_4)->arena +
               (ulong)(in_stack_fffffffffffffc34 >> 3)) != 0x1c8) && (kj::_::Debug::minSeverity < 3)
     ) {
    local_3a0.scopeId._0_4_ = 0x1c8;
    local_340.scopeId._0_4_ =
         *(undefined4 *)
          ((long)&((SegmentReader *)TStack_3e0.field_4)->arena +
          (ulong)(in_stack_fffffffffffffc34 >> 3));
    kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x97,ERROR,"\"failed: expected \" \"(456u) == (list[1])\", 456u, list[1]",
               (char (*) [37])"failed: expected (456u) == (list[1])",(uint *)&local_3a0.scopeId,
               (uint *)&local_340.scopeId);
  }
  if ((*(int *)((long)&((SegmentReader *)TStack_3e0.field_4)->arena +
               (ulong)(in_stack_fffffffffffffc34 >> 2)) != 0x315) && (kj::_::Debug::minSeverity < 3)
     ) {
    local_3a0.scopeId._0_4_ = 0x315;
    local_340.scopeId._0_4_ =
         *(undefined4 *)
          ((long)&((SegmentReader *)TStack_3e0.field_4)->arena +
          (ulong)(in_stack_fffffffffffffc34 >> 2));
    kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x98,ERROR,"\"failed: expected \" \"(789u) == (list[2])\", 789u, list[2]",
               (char (*) [37])"failed: expected (789u) == (list[2])",(uint *)&local_3a0.scopeId,
               (uint *)&local_340.scopeId);
  }
  uVar6 = (ulong)in_stack_fffffffffffffc34 * 3 >> 3;
  if ((*(int *)((long)&((SegmentReader *)TStack_3e0.field_4)->arena + uVar6) != 0x75bcd15) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_3a0.scopeId._0_4_ = 0x75bcd15;
    local_340.scopeId._0_4_ =
         *(undefined4 *)((long)&((SegmentReader *)TStack_3e0.field_4)->arena + uVar6);
    kj::_::Debug::log<char_const(&)[43],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x99,ERROR,
               "\"failed: expected \" \"(123456789u) == (list[3])\", 123456789u, list[3]",
               (char (*) [43])"failed: expected (123456789u) == (list[3])",
               (uint *)&local_3a0.scopeId,(uint *)&local_340.scopeId);
  }
  StructBuilder::asReader((StructBuilder *)&local_368);
  if (in_stack_fffffffffffffc3c == 0) {
    in_stack_fffffffffffffc40 = 0x7fffffff;
    aStack_398.schema = (RawBrandedSchema *)0x0;
    local_390.schema = (RawBrandedSchema *)0x0;
    local_3a0.schema = (RawBrandedSchema *)0x0;
  }
  else {
    local_390 = (anon_union_8_2_eba6ea51_for_Type_5)
                CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30);
    aStack_398 = (anon_union_8_2_eba6ea51_for_Type_5)TStack_3e0._0_8_;
    local_3a0 = local_3e8;
  }
  OStack_388.tag.content._0_4_ = in_stack_fffffffffffffc40;
  LVar8 = ListSchema::of(UINT32);
  sVar5 = LVar8.elementType._0_8_;
  reader.capTable = (CapTableReader *)aStack_398.schema;
  reader.segment = (SegmentReader *)local_3a0.schema;
  reader.pointer = (WirePointer *)local_390;
  reader._24_8_ = OStack_388.tag.content;
  PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic((Reader *)&local_150,reader,LVar8);
  local_340.schema = (RawBrandedSchema *)0x1c80000007b;
  aStack_338 = (anon_union_8_2_eba6ea51_for_Type_5)0x75bcd1500000315;
  reader_03.schema.elementType.field_4.schema = local_150.field_4.schema;
  reader_03.schema.elementType.baseType = local_150.baseType;
  reader_03.schema.elementType.listDepth = local_150.listDepth;
  reader_03.schema.elementType.isImplicitParam = local_150.isImplicitParam;
  reader_03.schema.elementType.field_3 = local_150.field_3;
  reader_03.schema.elementType._6_2_ = local_150._6_2_;
  reader_03.reader.segment = local_140;
  reader_03.reader.capTable = pCStack_138;
  reader_03.reader.ptr = local_130;
  reader_03.reader.elementCount = LStack_128;
  reader_03.reader.step = BStack_124;
  reader_03.reader.structDataSize = (StructDataBitCount)in_stack_fffffffffffffee0;
  reader_03.reader.structPointerCount = SUB82(in_stack_fffffffffffffee0,4);
  reader_03.reader.elementSize = SUB81(in_stack_fffffffffffffee0,6);
  reader_03.reader._39_1_ = SUB81(in_stack_fffffffffffffee0,7);
  reader_03.reader.nestingLimit = (int)in_stack_fffffffffffffee8;
  reader_03.reader._44_4_ = SUB84(in_stack_fffffffffffffee8,4);
  expected._M_len = sVar5;
  expected._M_array = (iterator)&local_340;
  (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Reader>(reader_03,expected);
  local_3e8 = local_368;
  TStack_3e0._0_8_ = in_stack_fffffffffffffca0;
  LVar8 = ListSchema::of(UINT32);
  sVar5 = LVar8.elementType._0_8_;
  builder_02.capTable = (CapTableBuilder *)in_stack_fffffffffffffca8;
  builder_02.segment = (SegmentBuilder *)in_stack_fffffffffffffca0.schema;
  builder_02.pointer = (WirePointer *)in_stack_fffffffffffffcb0;
  LVar8.elementType.field_4.schema = (RawBrandedSchema *)TStack_3e0._0_8_;
  LVar8.elementType._0_8_ = local_3e8.schema;
  PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic(builder_02,LVar8);
  local_3a0.schema = (RawBrandedSchema *)0x1c80000007b;
  aStack_398.schema = (RawBrandedSchema *)0x75bcd1500000315;
  reader_02.schema.elementType.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)uStack_248;
  reader_02.schema.elementType.baseType = (undefined2)local_250;
  reader_02.schema.elementType.listDepth = local_250._2_1_;
  reader_02.schema.elementType.isImplicitParam = (bool)local_250._3_1_;
  reader_02.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_250._4_2_;
  reader_02.schema.elementType._6_2_ = local_250._6_2_;
  reader_02.builder.segment = (SegmentBuilder *)local_240;
  reader_02.builder.capTable = (CapTableBuilder *)uStack_238;
  reader_02.builder.ptr = (byte *)local_230;
  reader_02.builder.elementCount = (undefined4)uStack_228;
  reader_02.builder.step = uStack_228._4_4_;
  reader_02.builder.structDataSize = (undefined4)local_220;
  reader_02.builder.structPointerCount = local_220._4_2_;
  reader_02.builder.elementSize = local_220._6_1_;
  reader_02.builder._39_1_ = local_220._7_1_;
  expected_00._M_len = sVar5;
  expected_00._M_array = (iterator)&local_3a0;
  (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Builder>(reader_02,expected_00);
  local_390 = in_stack_fffffffffffffca0;
  aStack_398 = local_368;
  local_3a0.schema = (RawBrandedSchema *)&PTR_s_e3da5a2ccd28c0d8_006370e0;
  local_3e8.scopeId._0_4_ = 6;
  TStack_3e0._0_8_ = "foo";
  TStack_3e0.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)0x4;
  name.content.size_ = 0x10;
  name.content.ptr = "anyPointerField";
  aVar12 = local_390;
  DynamicStruct::Builder::set((Builder *)&local_3a0,name,(Reader *)&local_3e8);
  DynamicValue::Reader::~Reader((Reader *)&local_3e8);
  local_3e8 = local_368;
  TStack_3e0._0_8_ = aVar12;
  TStack_3e0.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)in_stack_fffffffffffffcb0;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&local_3a0,(PointerBuilder *)&local_3e8,(void *)0x0,0);
  aVar2 = local_3e8;
  aVar3 = local_368;
  if (((local_390.schema != (RawBrandedSchema *)0x4) ||
      (iVar4 = bcmp(aStack_398.schema,"foo",3), aVar2 = local_3e8, aVar3 = local_368, iVar4 != 0))
     && (local_3e8 = aVar3, local_368 = local_3e8, kj::_::Debug::minSeverity < 3)) {
    TStack_3e0._0_8_ = aVar12;
    TStack_3e0.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)in_stack_fffffffffffffcb0;
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&local_3a0,(PointerBuilder *)&local_3e8,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[70],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0xa4,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (root.getAnyPointerField().getAs<Text>())\", \"foo\", root.getAnyPointerField().getAs<Text>()"
               ,(char (*) [70])
                "failed: expected (\"foo\") == (root.getAnyPointerField().getAs<Text>())",
               (char (*) [4])0x4fa6a4,(Builder *)&local_3a0);
    aVar2 = local_3e8;
  }
  local_3e8 = aVar2;
  OVar9 = MessageBuilder::getOrphanage((MessageBuilder *)&stack0xfffffffffffffef0);
  OrphanBuilder::initStruct
            ((OrphanBuilder *)&local_3e8,OVar9.arena,OVar9.capTable,(StructSize)0x140006);
  local_2d8 = (SegmentBuilder *)TStack_3e0.field_4;
  local_2e8.schema = local_3e8.schema;
  aStack_2e0 = (anon_union_8_2_eba6ea51_for_Type_5)TStack_3e0._0_8_;
  OrphanBuilder::asStruct(&local_278,(OrphanBuilder *)&local_2e8,(StructSize)0x140006);
  builder_03._builder.capTable._0_4_ = uVar15;
  builder_03._builder.segment = (SegmentBuilder *)wVar7.content;
  builder_03._builder.capTable._4_4_ = in_stack_fffffffffffffcdc;
  builder_03._builder.data = (void *)in_stack_fffffffffffffce0;
  builder_03._builder.pointers = (WirePointer *)in_stack_fffffffffffffce8;
  builder_03._builder.dataSize = in_stack_fffffffffffffcf0;
  builder_03._builder._36_4_ = in_stack_fffffffffffffcf4;
  OStack_388.segment = in_stack_fffffffffffffcb0;
  initTestMessage(builder_03);
  aStack_398 = local_368;
  local_3a0.schema = (RawBrandedSchema *)&PTR_s_e3da5a2ccd28c0d8_006370e0;
  pSVar13 = OStack_388.segment;
  OrphanBuilder::asStructReader
            ((StructReader *)&local_340,(OrphanBuilder *)&local_2e8,(StructSize)0x140006);
  local_3e8.scopeId._0_4_ = 10;
  TStack_3e0._0_8_ = schemas::s_a0a8f314b80b63fd + 0x48;
  TStack_3e0.field_4 = local_340;
  name_00.content.size_ = 0x10;
  name_00.content.ptr = "anyPointerField";
  DynamicStruct::Builder::set((Builder *)&local_3a0,name_00,(Reader *)&local_3e8);
  DynamicValue::Reader::~Reader((Reader *)&local_3e8);
  local_3e8 = local_368;
  PointerBuilder::getStruct
            (&local_2a0,(PointerBuilder *)&local_3e8,(StructSize)0x140006,(word *)0x0);
  checkTestMessage((Builder)stack0x000000e0);
  aStack_338 = local_368;
  local_340.schema = (RawBrandedSchema *)&PTR_s_e3da5a2ccd28c0d8_006370e0;
  OrphanBuilder::asStruct
            ((StructBuilder *)&stack0xfffffffffffffcf0,(OrphanBuilder *)&local_2e8,
             (StructSize)0x140006);
  uVar11 = (uint)((ulong)pSStack_308 >> 0x20);
  local_3e8.scopeId._0_4_ = 10;
  TStack_3e0._0_8_ = schemas::s_a0a8f314b80b63fd + 0x48;
  Orphan<capnp::DynamicValue>::Orphan
            ((Orphan<capnp::DynamicValue> *)&local_3a0,(Builder *)&local_3e8,
             (OrphanBuilder *)&local_2e8);
  DynamicValue::Builder::~Builder((Builder *)&local_3e8);
  name_01.content.size_ = 0x10;
  name_01.content.ptr = "anyPointerField";
  DynamicStruct::Builder::adopt
            ((Builder *)&local_340,name_01,(Orphan<capnp::DynamicValue> *)&local_3a0);
  if (OStack_388.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&OStack_388);
  }
  local_3e8 = local_368;
  TStack_3e0.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)pSVar13;
  TStack_3e0._0_8_ = aVar12.schema;
  PointerBuilder::getStruct
            (&local_2c8,(PointerBuilder *)&local_3e8,(StructSize)0x140006,(word *)0x0);
  checkTestMessage((Builder)stack0x000000e0);
  if (aStack_2e0.schema != (RawBrandedSchema *)0x0) {
    OrphanBuilder::euthanize((OrphanBuilder *)&local_2e8);
  }
  OVar9 = MessageBuilder::getOrphanage((MessageBuilder *)&stack0xfffffffffffffef0);
  OrphanBuilder::initList((OrphanBuilder *)&local_3e8,OVar9.arena,OVar9.capTable,3,FOUR_BYTES);
  uVar1 = TStack_3e0._0_8_;
  uVar14 = (uint)local_3e8.scopeId;
  uVar15 = (undefined4)((ulong)local_3e8 >> 0x20);
  OrphanBuilder::asList
            ((ListBuilder *)&local_3e8,(OrphanBuilder *)&stack0xfffffffffffffcf0,FOUR_BYTES);
  *(undefined4 *)TStack_3e0.field_4 = 0xc;
  OrphanBuilder::asList
            ((ListBuilder *)&local_3e8,(OrphanBuilder *)&stack0xfffffffffffffcf0,FOUR_BYTES);
  *(undefined4 *)((long)TStack_3e0.field_4 + (ulong)(uVar11 >> 3)) = 0x22;
  OrphanBuilder::asList
            ((ListBuilder *)&local_3e8,(OrphanBuilder *)&stack0xfffffffffffffcf0,FOUR_BYTES);
  *(undefined4 *)((long)TStack_3e0.field_4 + (ulong)(uVar11 >> 2)) = 0x38;
  aStack_398 = local_368;
  local_3a0.schema = (RawBrandedSchema *)&PTR_s_e3da5a2ccd28c0d8_006370e0;
  OrphanBuilder::asListReader
            ((ListReader *)&local_340,(OrphanBuilder *)&stack0xfffffffffffffcf0,FOUR_BYTES);
  TStack_3e0 = (Type)ListSchema::of(UINT32);
  iVar4 = (int)local_340.scopeId;
  uVar11 = (uint)((ulong)local_340 >> 0x20);
  local_3e8.scopeId._0_4_ = 8;
  name_02.content.size_ = 0x10;
  name_02.content.ptr = "anyPointerField";
  DynamicStruct::Builder::set((Builder *)&local_3a0,name_02,(Reader *)&local_3e8);
  DynamicValue::Reader::~Reader((Reader *)&local_3e8);
  local_3a0 = local_368;
  PointerBuilder::getList
            ((ListBuilder *)&local_3e8,(PointerBuilder *)&local_3a0,FOUR_BYTES,(word *)0x0);
  if (iVar4 != 3) {
    local_340.scopeId._0_4_ = 3;
    local_2e8.scopeId._0_4_ = iVar4;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,int,unsigned_int>
              ((Fault *)&local_3a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0xb7,FAILED,"(3) == (l.size())","3, l.size()",(int *)&local_340.scopeId,
               (uint *)&local_2e8.scopeId);
    kj::_::Debug::Fault::fatal((Fault *)&local_3a0);
  }
  if ((*(int *)&(TStack_3e0.field_4.schema)->generic != 0xc) && (kj::_::Debug::minSeverity < 3)) {
    local_3a0.scopeId._0_4_ = 0xc;
    local_340.scopeId._0_4_ = *(undefined4 *)&(TStack_3e0.field_4.schema)->generic;
    kj::_::Debug::log<char_const(&)[32],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0xb8,ERROR,"\"failed: expected \" \"(12) == (l[0])\", 12, l[0]",
               (char (*) [32])"failed: expected (12) == (l[0])",(int *)&local_3a0.scopeId,
               (uint *)&local_340.scopeId);
  }
  if ((*(int *)((long)&(TStack_3e0.field_4.schema)->generic + (ulong)(uVar11 >> 3)) != 0x22) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_3a0.scopeId._0_4_ = 0x22;
    local_340.scopeId._0_4_ =
         *(undefined4 *)((long)&(TStack_3e0.field_4.schema)->generic + (ulong)(uVar11 >> 3));
    kj::_::Debug::log<char_const(&)[32],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0xb9,ERROR,"\"failed: expected \" \"(34) == (l[1])\", 34, l[1]",
               (char (*) [32])"failed: expected (34) == (l[1])",(int *)&local_3a0.scopeId,
               (uint *)&local_340.scopeId);
  }
  if ((*(int *)((long)&(TStack_3e0.field_4.schema)->generic + (ulong)(uVar11 >> 2)) != 0x38) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_3a0.scopeId._0_4_ = 0x38;
    local_340.scopeId._0_4_ =
         *(undefined4 *)((long)&(TStack_3e0.field_4.schema)->generic + (ulong)(uVar11 >> 2));
    kj::_::Debug::log<char_const(&)[32],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0xba,ERROR,"\"failed: expected \" \"(56) == (l[2])\", 56, l[2]",
               (char (*) [32])"failed: expected (56) == (l[2])",(int *)&local_3a0.scopeId,
               (uint *)&local_340.scopeId);
  }
  if ((long *)uVar1 != (long *)0x0) {
    OrphanBuilder::euthanize((OrphanBuilder *)&stack0xfffffffffffffcf0);
  }
  aStack_398 = local_368;
  local_3a0.schema = (RawBrandedSchema *)&PTR_s_e3da5a2ccd28c0d8_006370e0;
  Capability::Client::Client((Client *)&stack0xfffffffffffffcf0,(void *)0x0);
  (**(code **)(*(long *)uVar1 + 0x20))(&local_340);
  local_3e8.scopeId._0_4_ = 0xb;
  TStack_3e0._0_8_ = local_340;
  TStack_3e0.field_4 = aStack_338;
  name_03.content.size_ = 0x10;
  name_03.content.ptr = "anyPointerField";
  DynamicStruct::Builder::set((Builder *)&local_3a0,name_03,(Reader *)&local_3e8);
  DynamicValue::Reader::~Reader((Reader *)&local_3e8);
  if ((long *)uVar1 != (long *)0x0) {
    (*(code *)**(undefined8 **)CONCAT44(uVar15,uVar14))
              ((undefined8 *)CONCAT44(uVar15,uVar14),uVar1 + *(long *)(*(long *)uVar1 + -0x10));
  }
  local_3e8 = local_368;
  OVar10 = PointerBuilder::getCapability((PointerBuilder *)&local_3a0);
  if (aStack_398.schema != (RawBrandedSchema *)0x0) {
    (*(code *)(local_3a0.schema)->generic->id)
              (local_3a0.schema,
               (long)&(aStack_398.schema)->generic +
               *(long *)&(aStack_398.schema)->generic[-1].defaultBrand.scopeCount,OVar10.ptr);
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&stack0xfffffffffffffef0);
  return;
}

Assistant:

TEST(DynamicApi, AnyPointers) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyPointer>();

  initDynamicTestMessage(
      root.getAnyPointerField().initAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkTestMessage(root.asReader().getAnyPointerField().getAs<TestAllTypes>());

  checkDynamicTestMessage(
      root.asReader().getAnyPointerField().getAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkDynamicTestMessage(
      root.getAnyPointerField().getAs<DynamicStruct>(Schema::from<TestAllTypes>()));

  {
    {
      auto list = root.getAnyPointerField().initAs<DynamicList>(Schema::from<List<uint32_t>>(), 4);
      list.set(0, 123);
      list.set(1, 456);
      list.set(2, 789);
      list.set(3, 123456789);
    }

    {
      auto list = root.asReader().getAnyPointerField().getAs<List<uint32_t>>();
      ASSERT_EQ(4u, list.size());
      EXPECT_EQ(123u, list[0]);
      EXPECT_EQ(456u, list[1]);
      EXPECT_EQ(789u, list[2]);
      EXPECT_EQ(123456789u, list[3]);
    }

    checkList<uint32_t>(root.asReader().getAnyPointerField().getAs<DynamicList>(
        Schema::from<List<uint32_t>>()), {123u, 456u, 789u, 123456789u});
    checkList<uint32_t>(root.getAnyPointerField().getAs<DynamicList>(
        Schema::from<List<uint32_t>>()), {123u, 456u, 789u, 123456789u});
  }

  // Setting an AnyPointer to various types should work.
  toDynamic(root).set("anyPointerField", capnp::Text::Reader("foo"));
  EXPECT_EQ("foo", root.getAnyPointerField().getAs<Text>());

  {
    auto orphan = builder.getOrphanage().newOrphan<TestAllTypes>();
    initTestMessage(orphan.get());
    toDynamic(root).set("anyPointerField", orphan.getReader());
    checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());

    toDynamic(root).adopt("anyPointerField", kj::mv(orphan));
    checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());
  }

  {
    auto lorphan = builder.getOrphanage().newOrphan<List<uint32_t>>(3);
    lorphan.get().set(0, 12);
    lorphan.get().set(1, 34);
    lorphan.get().set(2, 56);
    toDynamic(root).set("anyPointerField", lorphan.getReader());
    auto l = root.getAnyPointerField().getAs<List<uint32_t>>();
    ASSERT_EQ(3, l.size());
    EXPECT_EQ(12, l[0]);
    EXPECT_EQ(34, l[1]);
    EXPECT_EQ(56, l[2]);
  }

  // Just compile this one.
  toDynamic(root).set("anyPointerField", Capability::Client(nullptr));
  root.getAnyPointerField().getAs<Capability>();
}